

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op.cc
# Opt level: O2

const_iterator __thiscall PcodeOpBank::begin(PcodeOpBank *this,OpCode opc)

{
  if (opc == CPUI_RETURN) {
    return (const_iterator)
           (this->returnlist).super__List_base<PcodeOp_*,_std::allocator<PcodeOp_*>_>._M_impl.
           _M_node.super__List_node_base._M_next;
  }
  if (opc != CPUI_CALLOTHER) {
    if (opc == CPUI_STORE) {
      return (const_iterator)
             (this->storelist).super__List_base<PcodeOp_*,_std::allocator<PcodeOp_*>_>._M_impl.
             _M_node.super__List_node_base._M_next;
    }
    return (const_iterator)&this->alivelist;
  }
  return (const_iterator)
         (this->useroplist).super__List_base<PcodeOp_*,_std::allocator<PcodeOp_*>_>._M_impl._M_node.
         super__List_node_base._M_next;
}

Assistant:

list<PcodeOp *>::const_iterator PcodeOpBank::begin(OpCode opc) const

{
  switch(opc) {
  case CPUI_STORE:
    return storelist.begin();
  case CPUI_RETURN:
    return returnlist.begin();
  case CPUI_CALLOTHER:
    return useroplist.begin();
  default:
    break;
  }
  return alivelist.end();
}